

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_strategy.h
# Opt level: O2

int32_t __thiscall charls::decoder_strategy::read_high_bits(decoder_strategy *this)

{
  bool bVar1;
  int iVar2;
  
  iVar2 = peek_0_bits(this);
  if (iVar2 < 0) {
    this->valid_bits_ = this->valid_bits_ + -0xf;
    this->read_cache_ = this->read_cache_ << 0xf;
    iVar2 = 0xe;
    do {
      bVar1 = read_bit(this);
      iVar2 = iVar2 + 1;
    } while (!bVar1);
  }
  else {
    skip(this,iVar2 + 1);
  }
  return iVar2;
}

Assistant:

FORCE_INLINE int32_t read_high_bits()
    {
        const int32_t count{peek_0_bits()};
        if (count >= 0)
        {
            skip(count + 1);
            return count;
        }
        skip(15);

        for (int32_t high_bits_count{15};; ++high_bits_count)
        {
            if (read_bit())
                return high_bits_count;
        }
    }